

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O3

bool check_qclab_qgates_RotationY<std::complex<float>>
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v1,
               vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v2)

{
  pointer pcVar1;
  bool bVar2;
  pointer pcVar3;
  ulong uVar4;
  float fVar5;
  
  pcVar3 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)pcVar1 - (long)pcVar3 !=
      (long)(v2->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(v2->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("v1.size() == v2.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/test/qgates/RotationY.cpp"
                  ,0xb,
                  "bool check_qclab_qgates_RotationY(const std::vector<T> &, const std::vector<T> &) [T = std::complex<float>]"
                 );
  }
  if (pcVar1 == pcVar3) {
    bVar2 = true;
  }
  else {
    uVar4 = 0;
    do {
      fVar5 = cabsf((float)pcVar3[uVar4]._M_value -
                    (float)(v2->
                           super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_value);
      bVar2 = fVar5 <= 1.1920929e-05;
      if (1.1920929e-05 < fVar5) {
        return bVar2;
      }
      uVar4 = uVar4 + 1;
      pcVar3 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(v1->
                                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3 >> 3))
    ;
  }
  return bVar2;
}

Assistant:

bool check_qclab_qgates_RotationY( const std::vector< T >& v1 ,
                                   const std::vector< T >& v2 ) {

  using R = qclab::real_t< T > ;
  const R tol = 100 * std::numeric_limits< R >::epsilon() ;

  assert( v1.size() == v2.size() ) ;
  for ( size_t i = 0; i < v1.size(); ++i ) {
    if ( std::abs( v1[i] - v2[i] ) > tol ) return false ;
  }
  return true ;

}